

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backlog.cpp
# Opt level: O2

void __thiscall Backlog::remove_task(Backlog *this,shared_ptr<Task> *tsk)

{
  __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
  __last;
  __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
  __result;
  
  __result._M_current =
       (this->TaskuriNeplanificate).
       super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__result._M_current ==
        (this->TaskuriNeplanificate).
        super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    if ((tsk->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        ((__result._M_current)->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) break;
    __result._M_current = __result._M_current + 1;
  }
  __last._M_current =
       (this->TaskuriNeplanificate).
       super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__result._M_current + 1 != __last._M_current) {
    std::
    __copy_move_a<true,__gnu_cxx::__normal_iterator<std::shared_ptr<Task>*,std::vector<std::shared_ptr<Task>,std::allocator<std::shared_ptr<Task>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<Task>*,std::vector<std::shared_ptr<Task>,std::allocator<std::shared_ptr<Task>>>>>
              (__result._M_current + 1,__last,__result);
    __last._M_current =
         (this->TaskuriNeplanificate).
         super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  (this->TaskuriNeplanificate).
  super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>._M_impl.
  super__Vector_impl_data._M_finish = __last._M_current + -1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&__last._M_current[-1].super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void Backlog::remove_task(const std::shared_ptr<Task> &tsk) {
    for(auto i=TaskuriNeplanificate.begin(); i != TaskuriNeplanificate.end(); ++i)
        if(operator==(tsk, *i))
        {
            TaskuriNeplanificate.erase(i);
            break;
        }
}